

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O0

FilterAction __thiscall MyFilter::acceptNode(MyFilter *this,DOMNode *node)

{
  int iVar1;
  DOMNode *node_local;
  MyFilter *this_local;
  
  if (this->fNodeType == 0) {
    this_local._4_4_ = FILTER_ACCEPT;
  }
  else {
    iVar1 = (**(code **)(*(long *)node + 0x20))();
    if (iVar1 == this->fNodeType) {
      this_local._4_4_ = FILTER_ACCEPT;
    }
    else {
      this_local._4_4_ = FILTER_SKIP;
      if ((this->fReject & 1U) != 0) {
        this_local._4_4_ = FILTER_REJECT;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

DOMNodeFilter::FilterAction  MyFilter::acceptNode(const DOMNode* node) const {
    if (fNodeType == 0)
        return  DOMNodeFilter::FILTER_ACCEPT;
	if (node->getNodeType() ==  fNodeType) {
       	return  DOMNodeFilter::FILTER_ACCEPT;
	} else {
	    return  fReject ? DOMNodeFilter::FILTER_REJECT : DOMNodeFilter::FILTER_SKIP;
	}
}